

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 countLookasideSlots(LookasideSlot *p)

{
  u32 cnt;
  
  cnt = 0;
  for (; p != (LookasideSlot *)0x0; p = p->pNext) {
    cnt = cnt + 1;
  }
  return cnt;
}

Assistant:

static u32 countLookasideSlots(LookasideSlot *p){
  u32 cnt = 0;
  while( p ){
    p = p->pNext;
    cnt++;
  }
  return cnt;
}